

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O3

void __thiscall mp::SPAdapter::SPAdapter(SPAdapter *this,ColProblem *p)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer ppIVar1;
  Impl *pIVar2;
  ColProblem *pCVar3;
  int iVar4;
  Suffix stage_suffix;
  int *piVar5;
  pointer piVar6;
  pointer piVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  StringRef name;
  vector<int,_std::allocator<int>_> stage_offsets;
  allocator_type local_51;
  vector<int,_std::allocator<int>_> local_50;
  ColProblem *local_38;
  
  this->problem_ = p;
  (this->factory_)._vptr_BasicExprFactory = (_func_int **)&PTR__BasicExprFactory_00198798;
  memset(&(this->factory_).exprs_,0,0x140);
  this->num_stages_ = 1;
  (this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->num_stage_cons_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->con_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->con_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->con_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->con_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->con_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->con_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->linear_obj_).terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.
  m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_capacity = 6;
  (this->linear_obj_).terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.
  m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_data_ptr =
       (ptr)&(this->linear_obj_).terms_.
             super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.m_data.m_storage;
  (this->linear_obj_).terms_.super_small_vector_base<std::allocator<mp::LinearExpr::Term>,_6U>.
  m_data.super_small_vector_data_base<mp::LinearExpr::Term_*,_unsigned_long>.m_size = 0;
  (this->nonlinear_objs_).
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nonlinear_objs_).
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nonlinear_objs_).
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppIVar1 = (p->super_Problem).super_ExprFactory.funcs_.
            super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (uint)((ulong)((long)(p->super_Problem).super_ExprFactory.funcs_.
                                super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3);
  local_38 = p;
  if (0 < (int)uVar10) {
    uVar8 = 0;
    do {
      pIVar2 = ppIVar1[uVar8];
      iVar4 = strcmp(pIVar2->name,"random");
      if (iVar4 == 0) {
        (this->random_).impl_ = pIVar2;
        break;
      }
      uVar8 = uVar8 + 1;
    } while ((uVar10 & 0x7fffffff) != uVar8);
  }
  pCVar3 = local_38;
  this_00 = &this->num_stage_vars_;
  GetRandomVectors(this,&local_38->super_Problem);
  name.size_ = 5;
  name.data_ = "stage";
  stage_suffix = BasicSuffixSet<std::allocator<char>_>::Find
                           ((pCVar3->super_Problem).super_SuffixManager.suffixes_,name);
  if ((stage_suffix.super_SuffixBase.impl_ == (Impl *)0x0) ||
     ((*(byte *)((long)stage_suffix.super_SuffixBase.impl_ + 0x10) & 4) != 0)) {
    uVar10 = (uint)((ulong)((long)(this->problem_->super_Problem).vars_.
                                  super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->problem_->super_Problem).vars_.
                                 super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    if (0 < (int)uVar10) {
      uVar8 = 0;
      do {
        if ((this->var_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] == 0) {
          piVar5 = (this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((int)((ulong)((long)(this->num_stage_vars_).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)piVar5) >> 2) < 1) {
            std::vector<int,_std::allocator<int>_>::resize(this_00,1);
            piVar5 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
          }
          *piVar5 = *piVar5 + 1;
        }
        uVar8 = uVar8 + 1;
      } while ((uVar10 & 0x7fffffff) != uVar8);
    }
  }
  else {
    GetVarStages<mp::BasicSuffix<int>>(this,(BasicSuffix<int>)stage_suffix.super_SuffixBase.impl_);
  }
  piVar7 = (this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar6 = (this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar7 == piVar6) {
    std::vector<int,_std::allocator<int>_>::resize(this_00,1);
    piVar7 = (this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->num_stage_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  this->num_stages_ = (int)((ulong)((long)piVar6 - (long)piVar7) >> 2);
  uVar10 = (uint)((ulong)((long)(pCVar3->super_Problem).vars_.
                                super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pCVar3->super_Problem).vars_.
                               super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::Var>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->var_core2orig_,
             ((long)(this->random_vars_).
                    super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->random_vars_).
                    super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x5555555555555555 +
             (long)(int)uVar10);
  std::vector<int,_std::allocator<int>_>::vector(&local_50,(long)this->num_stages_,&local_51);
  if (1 < this->num_stages_) {
    piVar7 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = *local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    lVar9 = 1;
    do {
      iVar4 = iVar4 + piVar7[lVar9 + -1];
      local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar9] = iVar4;
      lVar9 = lVar9 + 1;
    } while (lVar9 < this->num_stages_);
  }
  if (0 < (int)uVar10) {
    piVar7 = (this->var_core2orig_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->var_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      lVar9 = (long)piVar6[uVar8];
      if (-1 < lVar9) {
        iVar4 = local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar9];
        local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar9] = iVar4 + 1;
        piVar7[iVar4] = (int)uVar8;
        piVar6[uVar8] = iVar4;
      }
      uVar8 = uVar8 + 1;
    } while ((uVar10 & 0x7fffffff) != uVar8);
  }
  ProcessObjs(this);
  ProcessCons(this);
  if (1 < this->num_stages_) {
    ExtractRandomTerms(this);
  }
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

SPAdapter::SPAdapter(const ColProblem &p): problem_(p), num_stages_(1) {
  // Find the random function.
  for (int i = 0, n = p.num_functions(); i < n; ++i) {
    auto function = p.function(i);
    if (std::strcmp(function.name(), "random") == 0) {
      random_ = function;
      break;
    }
  }

  GetRandomVectors(p);

  // Reorder variables by stages.
  if (IntSuffix stage_suffix = p.suffixes(suf::VAR).Find<int>("stage"))
    GetVarStages(stage_suffix);
  else
    GetVarStages(NullSuffix());
  if (num_stage_vars_.empty())
    num_stage_vars_.resize(1);
  num_stages_ = static_cast<int>(num_stage_vars_.size());
  int num_vars = p.num_vars();
  var_core2orig_.resize(num_vars - random_vars_.size());
  std::vector<int> stage_offsets(num_stages_);
  for (int i = 1; i < num_stages_; ++i)
    stage_offsets[i] = stage_offsets[i - 1] + num_stage_vars_[i - 1];
  for (int i = 0; i < num_vars; ++i) {
    int stage = var_orig2core_[i];
    if (stage < 0)
      continue;  // Skip random variables.
    int core_var_index = stage_offsets[stage]++;
    var_core2orig_[core_var_index] = i;
    var_orig2core_[i] = core_var_index;
  }

  ProcessObjs();
  ProcessCons();
  if (num_stages_ > 1)
    ExtractRandomTerms();
}